

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

Value * __thiscall GlobOptBlockData::FindValue(GlobOptBlockData *this,Sym *sym)

{
  uint uVar1;
  uint uVar2;
  SparseArray<Value> *pSVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  Value *pVVar7;
  Value **ppVVar8;
  SAChunk<Value> *pSVar9;
  
  if (this->symToValueMap == (GlobHashTable *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x508,"(this->symToValueMap)","this->symToValueMap");
    if (!bVar5) goto LAB_00497355;
    *puVar6 = 0;
  }
  if ((sym->m_kind == SymKindStack) && (((ulong)sym[1]._vptr_Sym & 0x10000) != 0)) {
    if (sym->m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar5) {
LAB_00497355:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
    }
    sym = &StackSym::GetVarEquivSym((StackSym *)sym,this->globOpt->func)->super_Sym;
  }
  else if (sym->m_kind == SymKindProperty) {
    pVVar7 = FindPropertyValue(this,sym->m_id);
    return pVVar7;
  }
  if (((((StackSym *)sym)->super_Sym).m_kind == SymKindStack) &&
     ((((StackSym *)sym)->field_0x1a & 4) != 0)) {
    pSVar3 = this->globOpt->byteCodeConstantValueArray;
    uVar1 = (((StackSym *)sym)->super_Sym).m_id;
    uVar2 = pSVar3->chunkSize;
    pSVar9 = (SAChunk<Value> *)&pSVar3->firstChunk;
    do {
      pSVar9 = pSVar9->next;
      if (pSVar9 == (SAChunk<Value> *)0x0) {
        return (Value *)0x0;
      }
      if (uVar1 < pSVar9->startIndex) {
        return (Value *)0x0;
      }
    } while (pSVar9->startIndex + uVar2 <= uVar1);
    pSVar9 = (&pSVar9[1].next)[(ulong)uVar1 % (ulong)uVar2];
  }
  else {
    ppVVar8 = ValueHashTable<Sym_*,_Value_*>::Get
                        (this->symToValueMap,(((StackSym *)sym)->super_Sym).m_id);
    if (ppVVar8 == (Value **)0x0) {
      pSVar9 = (SAChunk<Value> *)0x0;
    }
    else {
      pSVar9 = (SAChunk<Value> *)*ppVVar8;
    }
  }
  return (Value *)pSVar9;
}

Assistant:

Value*
GlobOptBlockData::FindValue(Sym *sym)
{
    Assert(this->symToValueMap);

    if (sym->IsStackSym() && sym->AsStackSym()->IsTypeSpec())
    {
        sym = sym->AsStackSym()->GetVarEquivSym(this->globOpt->func);
    }
    else if (sym->IsPropertySym())
    {
        return this->FindPropertyValue(sym->m_id);
    }

    if (sym->IsStackSym() && sym->AsStackSym()->IsFromByteCodeConstantTable())
    {
        return this->globOpt->byteCodeConstantValueArray->Get(sym->m_id);
    }
    else
    {
        return FindValueFromMapDirect(sym->m_id);
    }
}